

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

yyjson_mut_val *
duckdb_yyjson::unsafe_yyjson_mut_ptr_replacex
          (yyjson_mut_val *val,char *ptr,size_t len,yyjson_mut_val *new_val,yyjson_ptr_ctx *ctx,
          yyjson_ptr_err *err)

{
  yyjson_mut_val *pyVar1;
  yyjson_mut_val *pyVar2;
  yyjson_mut_val *pyVar3;
  yyjson_ptr_ctx *pyVar4;
  yyjson_ptr_ctx *pyVar5;
  yyjson_ptr_ctx cur_ctx;
  yyjson_ptr_ctx local_48;
  
  local_48.ctn = (yyjson_mut_val *)0x0;
  local_48.pre = (yyjson_mut_val *)0x0;
  local_48.old = (yyjson_mut_val *)0x0;
  pyVar5 = ctx;
  if (ctx == (yyjson_ptr_ctx *)0x0) {
    pyVar5 = &local_48;
  }
  pyVar3 = unsafe_yyjson_mut_ptr_getx(val,ptr,len,pyVar5,err);
  if (pyVar3 == (yyjson_mut_val *)0x0) {
    return (yyjson_mut_val *)0x0;
  }
  pyVar5 = (yyjson_ptr_ctx *)pyVar5->ctn;
  if (pyVar5 == (yyjson_ptr_ctx *)0x0) goto LAB_01d35eac;
  if ((~*(uint *)&pyVar5->ctn & 7) == 0) {
    pyVar4 = ctx;
    if (ctx == (yyjson_ptr_ctx *)0x0) {
      pyVar4 = &local_48;
    }
    if ((((pyVar5 != (yyjson_ptr_ctx *)0x0) && ((~*(uint *)&pyVar5->ctn & 7) == 0)) &&
        (pyVar1 = pyVar4->pre->next->next, pyVar1 != (yyjson_mut_val *)0x0)) &&
       ((pyVar1->tag & 7) == 5)) {
      unsafe_yyjson_mut_ptr_replacex();
    }
    goto LAB_01d35eac;
  }
  if (pyVar5 == (yyjson_ptr_ctx *)0x0) goto LAB_01d35eac;
  pyVar4 = ctx;
  if (ctx == (yyjson_ptr_ctx *)0x0) {
    pyVar4 = &local_48;
  }
  pyVar1 = pyVar4->pre;
  if (new_val == (yyjson_mut_val *)0x0 || pyVar1 == (yyjson_mut_val *)0x0) goto LAB_01d35eac;
  pyVar2 = pyVar1->next;
  if ((~*(uint *)&pyVar5->ctn & 7) == 0) {
    pyVar1 = pyVar2->next->next;
    pyVar2->next->next = new_val;
    new_val->next = pyVar1->next;
    pyVar5 = ctx;
    if (ctx == (yyjson_ptr_ctx *)0x0) {
      pyVar5 = &local_48;
    }
    pyVar5->old = pyVar1;
    goto LAB_01d35eac;
  }
  if (pyVar1 == pyVar2) {
    new_val->next = new_val;
    pyVar5->pre = new_val;
    pyVar5 = pyVar4;
LAB_01d35e9b:
    pyVar5->pre = new_val;
  }
  else {
    new_val->next = pyVar2->next;
    pyVar1->next = new_val;
    if (pyVar5->pre == pyVar2) goto LAB_01d35e9b;
  }
  pyVar5 = ctx;
  if (ctx == (yyjson_ptr_ctx *)0x0) {
    pyVar5 = &local_48;
  }
  pyVar5->old = pyVar2;
LAB_01d35eac:
  pyVar5 = &local_48;
  if (ctx != (yyjson_ptr_ctx *)0x0) {
    pyVar5 = ctx;
  }
  pyVar5->old = pyVar3;
  return pyVar3;
}

Assistant:

yyjson_mut_val *unsafe_yyjson_mut_ptr_replacex(
    yyjson_mut_val *val, const char *ptr, size_t len, yyjson_mut_val *new_val,
    yyjson_ptr_ctx *ctx, yyjson_ptr_err *err) {

    yyjson_mut_val *cur_val;
    yyjson_ptr_ctx cur_ctx;
    memset(&cur_ctx, 0, sizeof(cur_ctx));
    if (!ctx) ctx = &cur_ctx;
    cur_val = unsafe_yyjson_mut_ptr_getx(val, ptr, len, ctx, err);
    if (!cur_val) return NULL;

    if (yyjson_mut_is_obj(ctx->ctn)) {
        yyjson_mut_val *key = ctx->pre->next->next;
        yyjson_mut_obj_put(ctx->ctn, key, new_val);
    } else {
        yyjson_ptr_ctx_replace(ctx, new_val);
    }
    ctx->old = cur_val;
    return cur_val;
}